

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O2

bool __thiscall Company::isEnoughBudget(Company *this)

{
  int iVar1;
  int iVar2;
  int j;
  long lVar3;
  double dVar4;
  
  lVar3 = 0;
  iVar2 = 0;
  while( true ) {
    iVar1 = Boss::getNumberOfEmployee(this->boss);
    if (iVar1 <= lVar3) break;
    dVar4 = Employee::calculateSalary(this->employee[lVar3]);
    iVar2 = (int)((double)iVar2 + dVar4);
    lVar3 = lVar3 + 1;
  }
  return iVar2 <= this->budget;
}

Assistant:

bool Company::isEnoughBudget() {

    bool flag = false;
    int sum = 0;
    for (int j = 0; j < boss->getNumberOfEmployee(); j++) {
        sum += employee[j]->calculateSalary();
    }
    if(sum <= budget)
        flag = true;
    return flag;
}